

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

void google::protobuf::compiler::ruby::GenerateBinaryDescriptor
               (FileDescriptor *file,Printer *printer,string *error)

{
  char cVar1;
  char *in_RCX;
  FileDescriptor *file_00;
  ulong uVar2;
  string_view text;
  string_view src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string c_escaped;
  AlphaNum local_a0;
  char *local_70;
  size_t local_68;
  string local_50;
  
  SerializedDescriptor_abi_cxx11_(&local_50,(ruby *)file,(FileDescriptor *)error);
  src._M_str = in_RCX;
  src._M_len = (size_t)local_50._M_dataplus._M_p;
  absl::lts_20250127::CHexEscape_abi_cxx11_
            (&c_escaped,(lts_20250127 *)local_50._M_string_length,src);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_e0);
  for (uVar2 = 1; uVar2 - 1 < c_escaped._M_string_length; uVar2 = uVar2 + 1) {
    if ((c_escaped._M_dataplus._M_p[uVar2 - 1] == '#') && (uVar2 < c_escaped._M_string_length)) {
      cVar1 = c_escaped._M_dataplus._M_p[uVar2];
      if ((cVar1 == '$') || ((cVar1 == '{' || (cVar1 == '@')))) {
        local_a0.piece_ = absl::lts_20250127::NullSafeStringView("\\");
        absl::lts_20250127::StrAppend(&local_e0,&local_a0);
      }
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&c_escaped);
    local_a0.piece_._M_str = local_70;
    local_a0.piece_._M_len = local_68;
    absl::lts_20250127::StrAppend(&local_e0,&local_a0);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&c_escaped);
  DumpImportList_abi_cxx11_((string *)&local_a0,(ruby *)file,file_00);
  text._M_str = 
  "\ndescriptor_data = \"$descriptor_data$\"\n\npool = ::Google::Protobuf::DescriptorPool.generated_pool\npool.add_serialized_file(descriptor_data)\n\n"
  ;
  text._M_len = 0x8c;
  io::Printer::Print<char[16],std::__cxx11::string,char[8],std::__cxx11::string>
            (printer,text,(char (*) [16])"descriptor_data",&local_e0,(char (*) [8])0x417083,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void GenerateBinaryDescriptor(const FileDescriptor* file, io::Printer* printer,
                              std::string* error) {
  printer->Print(R"(
descriptor_data = "$descriptor_data$"

pool = ::Google::Protobuf::DescriptorPool.generated_pool
pool.add_serialized_file(descriptor_data)

)",
                 "descriptor_data", RubyEscape(SerializedDescriptor(file)),
                 "imports", DumpImportList(file));
}